

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O2

void pin_thread(int where)

{
  return;
}

Assistant:

void pin_thread(int where) {
	// Doesn't work on OS X right now
	// int j;
	// cpu_set_t cpuset;
	// pthread_t thread;
	// thread = pthread_self();
	// CPU_ZERO(&cpuset);
	// CPU_SET(where, &cpuset);
	// pthread_setaffinity_np(thread, sizeof(cpu_set_t), &cpuset);
	// int s = pthread_getaffinity_np(thread, sizeof(cpu_set_t), &cpuset);
	// if (s != 0) {
	// 	fprintf(stderr, "error: pthread_getaffinity_np");
	// 	exit(-1);
	// }
}